

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  allocator<char> local_31;
  string test_name;
  
  if (argc < 2) {
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&test_name,argv[1],&local_31);
  bVar1 = std::operator==(&test_name,"example");
  if (bVar1) {
    bVar1 = run_json_example();
    if (bVar1) {
      bVar1 = run_msgpack_example();
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = std::operator==(&test_name,"simple");
    if (!bVar1) {
      bVar1 = true;
      bVar2 = 0;
      goto LAB_00124c67;
    }
    bVar1 = run_simple_msgpack_test();
  }
  bVar2 = bVar1 ^ 1;
  bVar1 = false;
LAB_00124c67:
  std::__cxx11::string::~string((string *)&test_name);
  if (bVar1) {
    return 1;
  }
  return (uint)bVar2;
}

Assistant:

int main(int argc, char** argv)
{

  if (argc > 1)
  {
    std::string test_name = argv[1];
    if (test_name == "example")
      return (run_json_example() && run_msgpack_example() ? EXIT_SUCCESS : EXIT_FAILURE);
    else if (test_name == "simple")
      return (run_simple_msgpack_test() ? EXIT_SUCCESS : EXIT_FAILURE);
  }

  return EXIT_FAILURE;
}